

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t create_decode_tables(uint8_t *bit_length,decode_table *table,wchar_t size)

{
  uint16_t *__s;
  int iVar1;
  wchar_t wVar2;
  ulong uVar3;
  uint16_t uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint32_t uVar10;
  int iVar11;
  wchar_t wVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint32_t decode_pos_clone [16];
  int local_78 [18];
  
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  __s = table->decode_num;
  uVar15 = 0;
  memset(__s,0,0x264);
  table->size = size;
  table->quick_bits = (uint)(size == L'Ĳ') * 3 + 7;
  uVar3 = 0;
  if (L'\0' < size) {
    uVar3 = (ulong)(uint)size;
  }
  for (; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    local_78[bit_length[uVar15] & 0xf] = local_78[bit_length[uVar15] & 0xf] + 1;
  }
  table->decode_pos[0] = 0;
  table->decode_len[0] = 0;
  lVar8 = 1;
  uVar10 = 0;
  iVar11 = 0;
  lVar7 = 0xf;
  iVar13 = 0;
  while (lVar7 != 0) {
    iVar1 = local_78[lVar8];
    iVar11 = iVar11 + iVar1;
    uVar10 = uVar10 + iVar13;
    table->decode_len[lVar8] = iVar11 << ((byte)lVar7 & 0x1f);
    table->decode_pos[lVar8] = uVar10;
    iVar11 = iVar11 * 2;
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + -1;
    iVar13 = iVar1;
  }
  decode_pos_clone._48_8_ = *(undefined8 *)(table->decode_pos + 0xc);
  decode_pos_clone._56_8_ = *(undefined8 *)(table->decode_pos + 0xe);
  decode_pos_clone._32_8_ = *(undefined8 *)(table->decode_pos + 8);
  decode_pos_clone._40_8_ = *(undefined8 *)(table->decode_pos + 10);
  decode_pos_clone._16_8_ = *(undefined8 *)(table->decode_pos + 4);
  decode_pos_clone._24_8_ = *(undefined8 *)(table->decode_pos + 6);
  decode_pos_clone._0_8_ = *(undefined8 *)table->decode_pos;
  decode_pos_clone._8_8_ = *(undefined8 *)(table->decode_pos + 2);
  for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    uVar6 = (ulong)bit_length[uVar15] & 0xf;
    if ((bit_length[uVar15] & 0xf) != 0) {
      uVar10 = decode_pos_clone[uVar6];
      __s[(int)uVar10] = (uint16_t)uVar15;
      decode_pos_clone[uVar6] = uVar10 + 1;
    }
  }
  lVar8 = 1;
  lVar7 = 1L << ((byte)table->quick_bits & 0x3f);
  wVar2 = L'\x10' - table->quick_bits;
  lVar9 = 0;
  if (lVar7 < 1) {
    lVar7 = lVar9;
  }
  for (; lVar9 != lVar7; lVar9 = lVar9 + 1) {
    iVar11 = (int)lVar9 << ((byte)wVar2 & 0x1f);
    lVar14 = lVar8;
    lVar5 = 0x10;
    if (0x10 < lVar8) {
      lVar5 = lVar8;
    }
    for (; (lVar8 = lVar5, lVar5 != lVar14 && (lVar8 = lVar14, table->decode_len[lVar14] <= iVar11))
        ; lVar14 = lVar14 + 1) {
    }
    table->quick_len[lVar9] = (uint8_t)lVar8;
    uVar4 = 0;
    if ((lVar14 < 0x10) &&
       (wVar12 = (iVar11 - table->decode_len[lVar8 + -1] >> (0x10 - (uint8_t)lVar8 & 0x1f)) +
                 table->decode_pos[(uint)lVar8 & 0xf], uVar4 = 0, wVar12 < size)) {
      uVar4 = __s[wVar12];
    }
    table->quick_num[lVar9] = uVar4;
  }
  return wVar2;
}

Assistant:

static int create_decode_tables(uint8_t* bit_length,
    struct decode_table* table, int size)
{
	int code, upper_limit = 0, i, lc[16];
	uint32_t decode_pos_clone[rar5_countof(table->decode_pos)];
	ssize_t cur_len, quick_data_size;

	memset(&lc, 0, sizeof(lc));
	memset(table->decode_num, 0, sizeof(table->decode_num));
	table->size = size;
	table->quick_bits = size == HUFF_NC ? 10 : 7;

	for(i = 0; i < size; i++) {
		lc[bit_length[i] & 15]++;
	}

	lc[0] = 0;
	table->decode_pos[0] = 0;
	table->decode_len[0] = 0;

	for(i = 1; i < 16; i++) {
		upper_limit += lc[i];

		table->decode_len[i] = upper_limit << (16 - i);
		table->decode_pos[i] = table->decode_pos[i - 1] + lc[i - 1];

		upper_limit <<= 1;
	}

	memcpy(decode_pos_clone, table->decode_pos, sizeof(decode_pos_clone));

	for(i = 0; i < size; i++) {
		uint8_t clen = bit_length[i] & 15;
		if(clen > 0) {
			int last_pos = decode_pos_clone[clen];
			table->decode_num[last_pos] = i;
			decode_pos_clone[clen]++;
		}
	}

	quick_data_size = (int64_t)1 << table->quick_bits;
	cur_len = 1;
	for(code = 0; code < quick_data_size; code++) {
		int bit_field = code << (16 - table->quick_bits);
		int dist, pos;

		while(cur_len < rar5_countof(table->decode_len) &&
				bit_field >= table->decode_len[cur_len]) {
			cur_len++;
		}

		table->quick_len[code] = (uint8_t) cur_len;

		dist = bit_field - table->decode_len[cur_len - 1];
		dist >>= (16 - cur_len);

		pos = table->decode_pos[cur_len & 15] + dist;
		if(cur_len < rar5_countof(table->decode_pos) && pos < size) {
			table->quick_num[code] = table->decode_num[pos];
		} else {
			table->quick_num[code] = 0;
		}
	}

	return ARCHIVE_OK;
}